

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
SetMapIRCCommand::trigger
          (SetMapIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  size_t local_120;
  char *local_118;
  size_t local_100;
  char *local_f8;
  size_t local_e0;
  char *local_d8;
  size_t local_b0;
  char *local_a8;
  Server *server;
  uint i;
  int type;
  string_view map_name;
  Channel *chan;
  IRC_Bot *source_local;
  SetMapIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar6 = channel._M_str;
  pcVar7 = (char *)channel._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  if (bVar1) {
    bVar9 = sv("Error: Too few parameters. Syntax: setmap <map>",0x2f);
    local_120 = bVar9._M_len;
    local_118 = bVar9._M_str;
    Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,local_120,local_118);
  }
  else {
    map_name._M_str = pcVar7;
    lVar3 = Jupiter::IRC::Client::getChannel(source,pcVar7,pcVar6);
    if (lVar3 != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&i);
      Jupiter::IRC::Client::Channel::getType();
      server._0_4_ = 0;
      while( true ) {
        RenX::getCore();
        uVar4 = RenX::Core::getServerCount();
        if ((uint)server == uVar4) break;
        uVar4 = RenX::getCore();
        uVar5 = RenX::Core::getServer(uVar4);
        uVar4 = RenX::Server::isLogChanType((int)uVar5);
        if ((uVar4 & 1) != 0) {
          auVar8 = RenX::Server::getMapName(uVar5,parameters._M_len,parameters._M_str);
          map_name._M_len = auVar8._8_8_;
          _i = auVar8._0_8_;
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&i);
          if (bVar1) {
            bVar9 = sv("Error: Map not in rotation.",0x1b);
            local_b0 = bVar9._M_len;
            local_a8 = bVar9._M_str;
            Jupiter::IRC::Client::sendMessage(source,pcVar7,pcVar6,local_b0,local_a8);
          }
          else {
            bVar2 = RenX::Server::setMap(uVar5,_i,map_name._M_len);
            if ((bVar2 & 1) == 0) {
              bVar9 = sv("Error: Transmission error.",0x1a);
              local_e0 = bVar9._M_len;
              local_d8 = bVar9._M_str;
              Jupiter::IRC::Client::sendMessage(source,pcVar7,pcVar6,local_e0,local_d8);
            }
          }
        }
        server._0_4_ = (uint)server + 1;
      }
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&i);
      if (bVar1) {
        bVar9 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_100 = bVar9._M_len;
        local_f8 = bVar9._M_str;
        Jupiter::IRC::Client::sendMessage(source,pcVar7,pcVar6,local_100,local_f8);
      }
    }
  }
  return;
}

Assistant:

void SetMapIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			std::string_view map_name;
			int type = chan->getType();
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					map_name = server->getMapName(parameters);
					if (map_name.empty())
						source->sendMessage(channel, "Error: Map not in rotation."sv);
					else if (server->setMap(map_name) == false)
						source->sendMessage(channel, "Error: Transmission error."sv);
				}
			}
			if (map_name.empty())
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else
		source->sendNotice(nick, "Error: Too few parameters. Syntax: setmap <map>"sv);
}